

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<std::array<double,3ul>>(Attribute *this,array<double,_3UL> *v)

{
  double dVar1;
  value_type *pvVar2;
  optional<std::array<double,_3UL>_> ret;
  optional<std::array<double,_3UL>_> local_58;
  optional<std::array<double,_3UL>_> local_38;
  
  if (v == (array<double,_3UL> *)0x0) {
    local_58.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::array<double,3ul>>(&local_58,&this->_var);
    local_38.has_value_ = local_58.has_value_;
    if (local_58.has_value_ != false) {
      local_38.contained._16_8_ = local_58.contained._16_8_;
      local_38.contained.data.__align = local_58.contained.data.__align;
      local_38.contained._8_8_ = local_58.contained._8_8_;
      pvVar2 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value(&local_38);
      dVar1 = pvVar2->_M_elems[1];
      v->_M_elems[0] = pvVar2->_M_elems[0];
      v->_M_elems[1] = dVar1;
      v->_M_elems[2] = pvVar2->_M_elems[2];
    }
  }
  return local_58.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }